

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O1

int mbedtls_camellia_crypt_cfb128
              (mbedtls_camellia_context *ctx,int mode,size_t length,size_t *iv_off,uchar *iv,
              uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  int mode_00;
  size_t sVar4;
  
  sVar3 = *iv_off;
  if (mode == 0) {
    if (length != 0) {
      sVar4 = 0;
      mode_00 = 0;
      do {
        if (sVar3 == 0) {
          mbedtls_camellia_crypt_ecb(ctx,mode_00,iv,iv);
        }
        bVar1 = input[sVar4];
        output[sVar4] = iv[sVar3] ^ bVar1;
        iv[sVar3] = bVar1;
        sVar3 = (size_t)((int)sVar3 + 1U & 0xf);
        sVar4 = sVar4 + 1;
      } while (length != sVar4);
    }
  }
  else if (length != 0) {
    sVar4 = 0;
    do {
      if (sVar3 == 0) {
        mbedtls_camellia_crypt_ecb(ctx,mode,iv,iv);
      }
      bVar1 = input[sVar4];
      bVar2 = iv[sVar3];
      output[sVar4] = bVar1 ^ bVar2;
      iv[sVar3] = bVar1 ^ bVar2;
      sVar3 = (size_t)((int)sVar3 + 1U & 0xf);
      sVar4 = sVar4 + 1;
    } while (length != sVar4);
  }
  *iv_off = sVar3;
  return 0;
}

Assistant:

int mbedtls_camellia_crypt_cfb128( mbedtls_camellia_context *ctx,
                       int mode,
                       size_t length,
                       size_t *iv_off,
                       unsigned char iv[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c;
    size_t n = *iv_off;

    if( mode == MBEDTLS_CAMELLIA_DECRYPT )
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_camellia_crypt_ecb( ctx, MBEDTLS_CAMELLIA_ENCRYPT, iv, iv );

            c = *input++;
            *output++ = (unsigned char)( c ^ iv[n] );
            iv[n] = (unsigned char) c;

            n = ( n + 1 ) & 0x0F;
        }
    }
    else
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_camellia_crypt_ecb( ctx, MBEDTLS_CAMELLIA_ENCRYPT, iv, iv );

            iv[n] = *output++ = (unsigned char)( iv[n] ^ *input++ );

            n = ( n + 1 ) & 0x0F;
        }
    }

    *iv_off = n;

    return( 0 );
}